

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void aom_h_predictor_32x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  undefined1 (*pauVar7) [32];
  uint8_t *puVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  
  auVar1 = *(undefined1 (*) [32])left;
  auVar3 = vpunpcklbw_avx2(auVar1,auVar1);
  auVar4 = vpunpcklbw_avx2(auVar3,auVar3);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 4;
  auVar9[8] = 4;
  auVar9._0_8_ = 0x404040404040404;
  auVar9[9] = 4;
  auVar9[10] = 4;
  auVar9[0xb] = 4;
  auVar9[0xc] = 4;
  auVar9[0xd] = 4;
  auVar9[0xe] = 4;
  auVar9[0xf] = 4;
  auVar9[0x10] = 4;
  auVar9[0x11] = 4;
  auVar9[0x12] = 4;
  auVar9[0x13] = 4;
  auVar9[0x14] = 4;
  auVar9[0x15] = 4;
  auVar9[0x16] = 4;
  auVar9[0x17] = 4;
  auVar9[0x18] = 4;
  auVar9[0x19] = 4;
  auVar9[0x1a] = 4;
  auVar9[0x1b] = 4;
  auVar9[0x1c] = 4;
  auVar9[0x1d] = 4;
  auVar9[0x1e] = 4;
  auVar9[0x1f] = 4;
  pauVar7 = (undefined1 (*) [32])dst;
  do {
    auVar2 = vpshufb_avx2(auVar4,auVar10._0_32_);
    auVar5 = vpermq_avx2(auVar2,0x44);
    auVar2 = vpermq_avx2(auVar2,0xee);
    *pauVar7 = auVar5;
    *(undefined1 (*) [32])(*pauVar7 + stride * 0x10) = auVar2;
    pauVar7 = (undefined1 (*) [32])(*pauVar7 + stride);
    auVar2 = vpaddb_avx2(auVar10._0_32_,auVar9);
    auVar10 = ZEXT3264(auVar2);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  auVar3 = vpunpckhbw_avx2(auVar3,auVar3);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 4;
  puVar8 = dst;
  do {
    auVar4 = vpshufb_avx2(auVar3,auVar10._0_32_);
    auVar2 = vpermq_avx2(auVar4,0x44);
    auVar4 = vpermq_avx2(auVar4,0xee);
    *(undefined1 (*) [32])(puVar8 + stride * 4) = auVar2;
    *(undefined1 (*) [32])(puVar8 + stride * 0x14) = auVar4;
    auVar4 = vpaddb_avx2(auVar10._0_32_,auVar9);
    auVar10 = ZEXT3264(auVar4);
    puVar8 = puVar8 + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  auVar1 = vpunpckhbw_avx2(auVar1,auVar1);
  auVar3 = vpunpcklbw_avx2(auVar1,auVar1);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 4;
  puVar8 = dst;
  do {
    auVar4 = vpshufb_avx2(auVar3,auVar10._0_32_);
    auVar2 = vpermq_avx2(auVar4,0x44);
    auVar4 = vpermq_avx2(auVar4,0xee);
    *(undefined1 (*) [32])(puVar8 + stride * 8) = auVar2;
    *(undefined1 (*) [32])(puVar8 + stride * 0x18) = auVar4;
    auVar4 = vpaddb_avx2(auVar10._0_32_,auVar9);
    auVar10 = ZEXT3264(auVar4);
    puVar8 = puVar8 + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  auVar1 = vpunpckhbw_avx2(auVar1,auVar1);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 4;
  do {
    auVar3 = vpshufb_avx2(auVar1,auVar10._0_32_);
    auVar4 = vpermq_avx2(auVar3,0x44);
    auVar3 = vpermq_avx2(auVar3,0xee);
    *(undefined1 (*) [32])(dst + stride * 0xc) = auVar4;
    *(undefined1 (*) [32])(dst + stride * 0x1c) = auVar3;
    auVar3 = vpaddb_avx2(auVar10._0_32_,auVar9);
    auVar10 = ZEXT3264(auVar3);
    dst = dst + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void aom_h_predictor_32x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  (void)above;
  const __m256i left_col = _mm256_loadu_si256((__m256i const *)left);

  __m256i u = _mm256_unpacklo_epi8(left_col, left_col);

  __m256i v = _mm256_unpacklo_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  v = _mm256_unpackhi_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  u = _mm256_unpackhi_epi8(left_col, left_col);

  v = _mm256_unpacklo_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  v = _mm256_unpackhi_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
}